

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

bool __thiscall ON_SHA1_Hash::Read(ON_SHA1_Hash *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int local_2c;
  int local_28;
  int minor_version;
  int major_version;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_SHA1_Hash *this_local;
  
  *(undefined8 *)this->m_digest = ZeroDigest.m_digest._0_8_;
  *(undefined8 *)(this->m_digest + 8) = ZeroDigest.m_digest._8_8_;
  *(undefined4 *)(this->m_digest + 0x10) = ZeroDigest.m_digest._16_4_;
  minor_version._3_1_ = 0;
  local_28 = 0;
  local_2c = 0;
  _major_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_28,&local_2c);
  if (bVar1) {
    if ((local_28 == 1) && (bVar1 = ON_BinaryArchive::ReadByte(_major_version,0x14,this), bVar1)) {
      minor_version._3_1_ = 1;
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_major_version);
    if (!bVar1) {
      minor_version._3_1_ = 0;
    }
  }
  this_local._7_1_ = (bool)(minor_version._3_1_ & 1);
  return this_local._7_1_;
}

Assistant:

bool ON_SHA1_Hash::Read(
  class ON_BinaryArchive& archive
  )
{
  *this = ON_SHA1_Hash::ZeroDigest;
  bool rc = false;
  int major_version = 0;
  int minor_version = 0;
  if (!archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version))
    return rc;
  for (;;)
  {
    if ( 1 != major_version )
      break;
    if (!archive.ReadByte(20,m_digest))
      break;
    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}